

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

leveldb_comparator_t *
leveldb_comparator_create
          (void *state,_func_void_void_ptr *destructor,
          _func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *compare,_func_char_ptr_void_ptr *name)

{
  leveldb_comparator_t *this;
  leveldb_comparator_t *result;
  _func_char_ptr_void_ptr *name_local;
  _func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *compare_local;
  _func_void_void_ptr *destructor_local;
  void *state_local;
  
  this = (leveldb_comparator_t *)operator_new(0x28);
  leveldb_comparator_t::leveldb_comparator_t(this);
  this->state_ = state;
  this->destructor_ = destructor;
  this->compare_ = compare;
  this->name_ = name;
  return this;
}

Assistant:

leveldb_comparator_t* leveldb_comparator_create(
    void* state, void (*destructor)(void*),
    int (*compare)(void*, const char* a, size_t alen, const char* b,
                   size_t blen),
    const char* (*name)(void*)) {
  leveldb_comparator_t* result = new leveldb_comparator_t;
  result->state_ = state;
  result->destructor_ = destructor;
  result->compare_ = compare;
  result->name_ = name;
  return result;
}